

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O0

int help(int argc,char **argv)

{
  FILE *pFVar1;
  bool bVar2;
  undefined8 uVar3;
  long *in_RSI;
  int in_EDI;
  iterator iter;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>_>_>
  *in_stack_ffffffffffffff78;
  _Self local_58;
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  string local_38 [32];
  _Self local_18;
  long *local_10;
  
  local_10 = in_RSI;
  if (in_EDI == 0) {
    help();
  }
  else {
    for (; *local_10 != 0; local_10 = local_10 + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      local_18._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>_>_>
           ::find(in_stack_ffffffffffffff78,(key_type *)0x3d1106);
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
      local_58._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>_>_>
           ::end(in_stack_ffffffffffffff78);
      bVar2 = std::operator==(&local_18,&local_58);
      pFVar1 = _stderr;
      if (bVar2) {
        fprintf(_stderr,"imgtool help: command \"%s\" not known.\n",*local_10);
        help();
        return 1;
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>_>
                    *)0x3d11d6);
      uVar3 = std::__cxx11::string::c_str();
      fprintf(pFVar1,"usage: imgtool %s\n\n",uVar3);
      pFVar1 = _stderr;
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CommandUsage>_>
                    *)0x3d1211);
      uVar3 = std::__cxx11::string::c_str();
      fprintf(pFVar1,"options:%s\n",uVar3);
    }
  }
  return 0;
}

Assistant:

int help(int argc, char **argv) {
    if (argc == 0) {
        help();
        return 0;
    }
    while (*argv != nullptr) {
        auto iter = commandUsage.find(*argv);
        if (iter == commandUsage.end()) {
            fprintf(stderr, "imgtool help: command \"%s\" not known.\n", *argv);
            help();
            return 1;
        } else {
            fprintf(stderr, "usage: imgtool %s\n\n", iter->second.usage.c_str());
            fprintf(stderr, "options:%s\n", iter->second.options.c_str());
        }
        ++argv;
    }
    return 0;
}